

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> __thiscall
libtorrent::torrent_handle::
sync_call_ret<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>)const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&>
          (torrent_handle *this,
          strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> def,
          offset_in_torrent_to_subr f,strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *a)

{
  session_impl *ses;
  io_context *ctx;
  undefined8 uVar1;
  uint *in_R8;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> r;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::torrent> t;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_9a;
  bool local_99;
  exception_ptr local_98;
  exception_ptr local_90;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_78 [64];
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> local_38;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,this);
  local_9a.m_val = def.m_val;
  if (local_88._M_ptr == (element_type *)0x0) {
    throw_invalid_handle();
  }
  ses = (session_impl *)((local_88._M_ptr)->super_torrent_hot_members).m_ses;
  local_78._8_8_ = &local_99;
  local_78._24_8_ = &local_98;
  local_98._M_exception_object = (void *)0x0;
  local_99 = false;
  ctx = ses->m_io_context;
  local_78._0_8_ = &local_9a;
  local_78._16_8_ = ses;
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x20)
             ,&local_88);
  local_38.m_val = *in_R8;
  local_78._48_8_ = f;
  local_78._56_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::sync_call_ret<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>)const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&>(libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>)const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&)const::_lambda()_1_>
            (ctx,(type_conflict4 *)local_78,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x28));
  aux::torrent_wait(&local_99,ses);
  if (local_98._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_98);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    return (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>)local_9a.m_val;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_90,&local_98);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_90);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_98);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

Ret torrent_handle::sync_call_ret(Ret def, Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		Ret r = def;
#ifndef BOOST_NO_EXCEPTIONS
		if (!t) throw_invalid_handle();
#else
		if (!t) return r;
#endif
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&r,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);

		if (ex) std::rethrow_exception(ex);
		return r;
	}